

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas_lite.c
# Opt level: O3

int strsm_(char *side,char *uplo,char *transa,char *diag,integer *m,integer *n,real *alpha,real *a,
          integer *lda,real *b,integer *ldb)

{
  uint uVar1;
  integer iVar2;
  logical lVar3;
  logical lVar4;
  logical lVar5;
  logical lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  real *prVar10;
  int iVar11;
  integer *piVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  real *prVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  bool bVar28;
  float fVar29;
  
  iVar11 = *lda;
  uVar7 = (ulong)iVar11;
  iVar22 = *ldb;
  uVar8 = (ulong)iVar22;
  lVar3 = lsame_(side,"L");
  piVar12 = m;
  if (lVar3 == 0) {
    piVar12 = n;
  }
  iVar23 = *piVar12;
  lVar4 = lsame_(diag,"N");
  lVar5 = lsame_(uplo,"U");
  strsm_::info = 0;
  if ((lVar3 == 0) && (lVar6 = lsame_(side,"R"), lVar6 == 0)) {
    iVar2 = 1;
  }
  else if ((lVar5 == 0) && (lVar6 = lsame_(uplo,"L"), lVar6 == 0)) {
    iVar2 = 2;
  }
  else {
    lVar6 = lsame_(transa,"N");
    if (((lVar6 == 0) && (lVar6 = lsame_(transa,"T"), lVar6 == 0)) &&
       (lVar6 = lsame_(transa,"C"), lVar6 == 0)) {
      iVar2 = 3;
    }
    else {
      lVar6 = lsame_(diag,"U");
      if ((lVar6 == 0) && (lVar6 = lsame_(diag,"N"), lVar6 == 0)) {
        iVar2 = 4;
      }
      else {
        iVar15 = *m;
        if (iVar15 < 0) {
          iVar2 = 5;
        }
        else {
          uVar26 = (ulong)(uint)*n;
          if (*n < 0) {
            iVar2 = 6;
          }
          else {
            iVar17 = 1;
            if (1 < iVar23) {
              iVar17 = iVar23;
            }
            iVar2 = 9;
            if (((iVar17 <= *lda) && (iVar2 = 0xb, (int)(iVar15 + (uint)(iVar15 == 0)) <= *ldb)) &&
               (iVar2 = strsm_::info, strsm_::info == 0)) {
              if (uVar26 == 0) {
                return 0;
              }
              uVar9 = ~uVar8;
              if ((*alpha == 0.0) && (!NAN(*alpha))) {
                iVar11 = iVar22 + 1;
                uVar24 = *m;
                do {
                  if (0 < (int)uVar24) {
                    memset(b + uVar9 + (long)iVar11,0,(ulong)uVar24 << 2);
                  }
                  iVar11 = iVar11 + iVar22;
                  uVar26 = uVar26 - 1;
                } while (uVar26 != 0);
                return 0;
              }
              uVar13 = ~uVar7;
              lVar6 = lsame_(transa,"N");
              uVar24 = *n;
              uVar26 = (ulong)uVar24;
              if (lVar3 == 0) {
                if (lVar6 == 0) {
                  if (lVar5 == 0) {
                    if ((int)uVar24 < 1) {
                      return 0;
                    }
                    iVar23 = *n;
                    prVar10 = b + uVar8 + uVar9;
                    iVar15 = iVar22 * 2;
                    uVar27 = 1;
                    do {
                      if ((lVar4 != 0) && (uVar24 = *m, 0 < (int)uVar24)) {
                        fVar29 = a[uVar13 + (long)((iVar11 + 1) * (int)uVar27)];
                        lVar16 = 1;
                        do {
                          prVar10[lVar16] = prVar10[lVar16] * (1.0 / fVar29);
                          lVar16 = lVar16 + 1;
                        } while ((ulong)uVar24 + 1 != lVar16);
                      }
                      if ((int)uVar27 < iVar23) {
                        uVar25 = uVar27 & 0xffffffff;
                        iVar17 = iVar15;
                        do {
                          fVar29 = a[uVar13 + uVar27 * uVar7 + (long)(int)uVar25 + 1];
                          if (((fVar29 != 0.0) || (NAN(fVar29))) && (uVar24 = *m, 0 < (int)uVar24))
                          {
                            lVar16 = 1;
                            do {
                              b[uVar9 + iVar17 + lVar16] =
                                   prVar10[lVar16] * -fVar29 + b[uVar9 + iVar17 + lVar16];
                              lVar16 = lVar16 + 1;
                            } while ((ulong)uVar24 + 1 != lVar16);
                          }
                          uVar24 = (int)uVar25 + 1;
                          uVar25 = (ulong)uVar24;
                          iVar17 = iVar17 + iVar22;
                        } while ((int)uVar24 < iVar23);
                      }
                      if (((*alpha != 1.0) || (NAN(*alpha))) && (uVar24 = *m, 0 < (int)uVar24)) {
                        lVar16 = 1;
                        do {
                          prVar10[lVar16] = *alpha * prVar10[lVar16];
                          lVar16 = lVar16 + 1;
                        } while ((ulong)uVar24 + 1 != lVar16);
                      }
                      uVar27 = uVar27 + 1;
                      prVar10 = prVar10 + uVar8;
                      iVar15 = iVar15 + iVar22;
                    } while (uVar27 != uVar26 + 1);
                    return 0;
                  }
                  if ((int)uVar24 < 1) {
                    return 0;
                  }
                  prVar10 = b + uVar26 * uVar8 + uVar9;
                  do {
                    if ((lVar4 != 0) && (uVar24 = *m, 0 < (int)uVar24)) {
                      fVar29 = a[uVar13 + (long)((iVar11 + 1) * (int)uVar26)];
                      lVar16 = 1;
                      do {
                        prVar10[lVar16] = prVar10[lVar16] * (1.0 / fVar29);
                        lVar16 = lVar16 + 1;
                      } while ((ulong)uVar24 + 1 != lVar16);
                    }
                    if (1 < (long)uVar26) {
                      uVar27 = 1;
                      prVar19 = b + uVar8 + uVar9;
                      do {
                        fVar29 = a[uVar13 + uVar26 * uVar7 + uVar27];
                        if (((fVar29 != 0.0) || (NAN(fVar29))) && (uVar24 = *m, 0 < (int)uVar24)) {
                          lVar16 = 1;
                          do {
                            prVar19[lVar16] = prVar10[lVar16] * -fVar29 + prVar19[lVar16];
                            lVar16 = lVar16 + 1;
                          } while ((ulong)uVar24 + 1 != lVar16);
                        }
                        uVar27 = uVar27 + 1;
                        prVar19 = prVar19 + uVar8;
                      } while (uVar27 != uVar26);
                    }
                    if (((*alpha != 1.0) || (NAN(*alpha))) && (uVar24 = *m, 0 < (int)uVar24)) {
                      lVar16 = 1;
                      do {
                        prVar10[lVar16] = *alpha * prVar10[lVar16];
                        lVar16 = lVar16 + 1;
                      } while ((ulong)uVar24 + 1 != lVar16);
                    }
                    prVar10 = prVar10 + -uVar8;
                    bVar28 = 1 < (long)uVar26;
                    uVar26 = uVar26 - 1;
                  } while (bVar28);
                  return 0;
                }
                if (lVar5 == 0) {
                  if ((int)uVar24 < 1) {
                    return 0;
                  }
                  iVar23 = *n;
                  prVar10 = b + uVar26 * uVar8 + uVar9;
                  iVar15 = (uVar24 + 1) * iVar22;
                  do {
                    if (((*alpha != 1.0) || (NAN(*alpha))) && (uVar24 = *m, 0 < (int)uVar24)) {
                      lVar16 = 1;
                      do {
                        prVar10[lVar16] = *alpha * prVar10[lVar16];
                        lVar16 = lVar16 + 1;
                      } while ((ulong)uVar24 + 1 != lVar16);
                    }
                    if ((int)uVar26 < iVar23) {
                      uVar27 = uVar26 & 0xffffffff;
                      iVar17 = iVar15;
                      do {
                        iVar20 = (int)uVar27;
                        lVar16 = (long)iVar20 + 1;
                        if (((a[uVar13 + uVar26 * uVar7 + (long)iVar20 + 1] != 0.0) ||
                            (NAN(a[uVar13 + uVar26 * uVar7 + (long)iVar20 + 1]))) &&
                           (uVar24 = *m, 0 < (int)uVar24)) {
                          lVar18 = 1;
                          do {
                            prVar10[lVar18] =
                                 prVar10[lVar18] -
                                 a[uVar13 + uVar26 * uVar7 + lVar16] * b[uVar9 + iVar17 + lVar18];
                            lVar18 = lVar18 + 1;
                          } while ((ulong)uVar24 + 1 != lVar18);
                        }
                        uVar27 = (ulong)(iVar20 + 1);
                        iVar17 = iVar17 + iVar22;
                      } while ((int)lVar16 < iVar23);
                    }
                    if ((lVar4 != 0) && (uVar24 = *m, 0 < (int)uVar24)) {
                      fVar29 = a[uVar13 + (long)((iVar11 + 1) * (int)uVar26)];
                      lVar16 = 1;
                      do {
                        prVar10[lVar16] = prVar10[lVar16] * (1.0 / fVar29);
                        lVar16 = lVar16 + 1;
                      } while ((ulong)uVar24 + 1 != lVar16);
                    }
                    prVar10 = prVar10 + -uVar8;
                    iVar15 = iVar15 - iVar22;
                    bVar28 = 1 < (long)uVar26;
                    uVar26 = uVar26 - 1;
                  } while (bVar28);
                  return 0;
                }
                if ((int)uVar24 < 1) {
                  return 0;
                }
                uVar27 = 1;
                prVar10 = b + uVar8 + uVar9;
                do {
                  if (((*alpha != 1.0) || (NAN(*alpha))) && (uVar24 = *m, 0 < (int)uVar24)) {
                    lVar16 = 1;
                    do {
                      prVar10[lVar16] = *alpha * prVar10[lVar16];
                      lVar16 = lVar16 + 1;
                    } while ((ulong)uVar24 + 1 != lVar16);
                  }
                  if (1 < uVar27) {
                    uVar25 = 1;
                    prVar19 = b + uVar8 + uVar9;
                    do {
                      if (((a[uVar13 + uVar27 * uVar7 + uVar25] != 0.0) ||
                          (NAN(a[uVar13 + uVar27 * uVar7 + uVar25]))) &&
                         (uVar24 = *m, 0 < (int)uVar24)) {
                        lVar16 = 1;
                        do {
                          prVar10[lVar16] =
                               prVar10[lVar16] -
                               a[uVar13 + uVar27 * uVar7 + uVar25] * prVar19[lVar16];
                          lVar16 = lVar16 + 1;
                        } while ((ulong)uVar24 + 1 != lVar16);
                      }
                      uVar25 = uVar25 + 1;
                      prVar19 = prVar19 + uVar8;
                    } while (uVar25 != uVar27);
                  }
                  if ((lVar4 != 0) && (uVar24 = *m, 0 < (int)uVar24)) {
                    fVar29 = a[uVar13 + (long)((iVar11 + 1) * (int)uVar27)];
                    lVar16 = 1;
                    do {
                      prVar10[lVar16] = prVar10[lVar16] * (1.0 / fVar29);
                      lVar16 = lVar16 + 1;
                    } while ((ulong)uVar24 + 1 != lVar16);
                  }
                  uVar27 = uVar27 + 1;
                  prVar10 = prVar10 + uVar8;
                } while (uVar27 != uVar26 + 1);
                return 0;
              }
              if (lVar6 == 0) {
                if (lVar5 == 0) {
                  if ((int)uVar24 < 1) {
                    return 0;
                  }
                  uVar24 = *m;
                  lVar16 = 1;
                  do {
                    if (0 < (int)uVar24) {
                      lVar18 = lVar16 * uVar8;
                      iVar22 = *m;
                      uVar27 = (ulong)uVar24;
                      iVar23 = uVar24 + 1;
                      do {
                        fVar29 = *alpha * b[uVar9 + lVar18 + uVar27];
                        if ((int)uVar27 < iVar22) {
                          iVar15 = iVar23;
                          do {
                            fVar29 = fVar29 - a[uVar13 + uVar27 * uVar7 + (long)iVar15] *
                                              b[uVar9 + lVar18 + iVar15];
                            bVar28 = iVar15 != iVar22;
                            iVar15 = iVar15 + 1;
                          } while (bVar28);
                        }
                        if (lVar4 != 0) {
                          fVar29 = fVar29 / a[uVar13 + (long)((iVar11 + 1) * (int)uVar27)];
                        }
                        b[uVar9 + lVar18 + uVar27] = fVar29;
                        iVar23 = iVar23 + -1;
                        bVar28 = 1 < (long)uVar27;
                        uVar27 = uVar27 - 1;
                      } while (bVar28);
                    }
                    lVar16 = lVar16 + 1;
                  } while (lVar16 != uVar26 + 1);
                  return 0;
                }
                if ((int)uVar24 < 1) {
                  return 0;
                }
                uVar24 = *m;
                prVar10 = b + uVar8 + uVar9 + 1;
                lVar16 = 1;
                do {
                  if (0 < (int)uVar24) {
                    uVar27 = 1;
                    lVar18 = 0;
                    prVar19 = a + uVar13 + uVar7 + 1;
                    do {
                      fVar29 = *alpha * b[uVar9 + lVar16 * uVar8 + uVar27];
                      if (1 < uVar27) {
                        lVar21 = 0;
                        do {
                          fVar29 = fVar29 - prVar19[lVar21] * prVar10[lVar21];
                          lVar21 = lVar21 + 1;
                        } while (lVar18 != lVar21);
                      }
                      if (lVar4 != 0) {
                        fVar29 = fVar29 / a[uVar13 + (long)((iVar11 + 1) * (int)uVar27)];
                      }
                      b[uVar9 + lVar16 * uVar8 + uVar27] = fVar29;
                      uVar27 = uVar27 + 1;
                      prVar19 = prVar19 + uVar7;
                      lVar18 = lVar18 + 1;
                    } while (uVar27 != (ulong)uVar24 + 1);
                  }
                  lVar16 = lVar16 + 1;
                  prVar10 = prVar10 + uVar8;
                } while (lVar16 != uVar26 + 1);
                return 0;
              }
              if (lVar5 == 0) {
                if ((int)uVar24 < 1) {
                  return 0;
                }
                uVar24 = *m;
                prVar10 = b + uVar8 + uVar9;
                lVar16 = 1;
                do {
                  if (((*alpha != 1.0) || (NAN(*alpha))) && (uVar1 = *m, 0 < (int)uVar1)) {
                    lVar18 = 1;
                    do {
                      prVar10[lVar18] = *alpha * prVar10[lVar18];
                      lVar18 = lVar18 + 1;
                    } while ((ulong)uVar1 + 1 != lVar18);
                  }
                  if (0 < (int)uVar24) {
                    lVar18 = lVar16 * uVar8;
                    lVar21 = 1;
                    iVar22 = 2;
                    do {
                      fVar29 = b[uVar9 + lVar18 + lVar21];
                      if ((fVar29 != 0.0) || (NAN(fVar29))) {
                        if (lVar4 != 0) {
                          b[uVar9 + lVar18 + lVar21] =
                               fVar29 / a[uVar13 + (long)((iVar11 + 1) * (int)lVar21)];
                        }
                        iVar23 = *m;
                        if ((int)lVar21 < iVar23) {
                          iVar15 = iVar22;
                          do {
                            lVar14 = (long)iVar15;
                            b[uVar9 + lVar18 + lVar14] =
                                 b[uVar9 + lVar18 + lVar14] -
                                 b[uVar9 + lVar18 + lVar21] * a[uVar13 + lVar21 * uVar7 + lVar14];
                            bVar28 = iVar15 != iVar23;
                            iVar15 = iVar15 + 1;
                          } while (bVar28);
                        }
                      }
                      lVar21 = lVar21 + 1;
                      iVar22 = iVar22 + 1;
                    } while (lVar21 != (ulong)uVar24 + 1);
                  }
                  lVar16 = lVar16 + 1;
                  prVar10 = prVar10 + uVar8;
                } while (lVar16 != uVar26 + 1);
                return 0;
              }
              if ((int)uVar24 < 1) {
                return 0;
              }
              uVar24 = *m;
              prVar10 = b + uVar8 + uVar9;
              lVar16 = 1;
              do {
                if (((*alpha != 1.0) || (NAN(*alpha))) && (uVar1 = *m, 0 < (int)uVar1)) {
                  lVar18 = 1;
                  do {
                    prVar10[lVar18] = *alpha * prVar10[lVar18];
                    lVar18 = lVar18 + 1;
                  } while ((ulong)uVar1 + 1 != lVar18);
                }
                if (0 < (int)uVar24) {
                  lVar18 = lVar16 * uVar8;
                  prVar19 = a + uVar13 + uVar7 * uVar24;
                  uVar27 = (ulong)uVar24;
                  do {
                    fVar29 = b[uVar9 + lVar18 + uVar27];
                    if ((fVar29 != 0.0) || (NAN(fVar29))) {
                      if (lVar4 != 0) {
                        b[uVar9 + lVar18 + uVar27] =
                             fVar29 / a[uVar13 + (long)((iVar11 + 1) * (int)uVar27)];
                      }
                      if (1 < (long)uVar27) {
                        uVar25 = 1;
                        do {
                          prVar10[uVar25] =
                               prVar10[uVar25] - b[uVar9 + lVar18 + uVar27] * prVar19[uVar25];
                          uVar25 = uVar25 + 1;
                        } while (uVar27 != uVar25);
                      }
                    }
                    prVar19 = prVar19 + -uVar7;
                    bVar28 = 1 < (long)uVar27;
                    uVar27 = uVar27 - 1;
                  } while (bVar28);
                }
                lVar16 = lVar16 + 1;
                prVar10 = prVar10 + uVar8;
              } while (lVar16 != uVar26 + 1);
              return 0;
            }
          }
        }
      }
    }
  }
  strsm_::info = iVar2;
  xerbla_("STRSM ",&strsm_::info);
  return 0;
}

Assistant:

int strsm_(char *side, char *uplo, char *transa, char *diag,
	integer *m, integer *n, real *alpha, real *a, integer *lda, real *b,
	integer *ldb)
{
    /* System generated locals */
    integer a_dim1, a_offset, b_dim1, b_offset, i__1, i__2, i__3;

    /* Local variables */
    static integer i__, j, k, info;
    static real temp;
    static logical lside;
    extern logical lsame_(char *, char *);
    static integer nrowa;
    static logical upper;
    extern /* Subroutine */ int xerbla_(char *, integer *);
    static logical nounit;


/*
    Purpose
    =======

    STRSM  solves one of the matrix equations

       op( A )*X = alpha*B,   or   X*op( A ) = alpha*B,

    where alpha is a scalar, X and B are m by n matrices, A is a unit, or
    non-unit,  upper or lower triangular matrix  and  op( A )  is one  of

       op( A ) = A   or   op( A ) = A'.

    The matrix X is overwritten on B.

    Parameters
    ==========

    SIDE   - CHARACTER*1.
             On entry, SIDE specifies whether op( A ) appears on the left
             or right of X as follows:

                SIDE = 'L' or 'l'   op( A )*X = alpha*B.

                SIDE = 'R' or 'r'   X*op( A ) = alpha*B.

             Unchanged on exit.

    UPLO   - CHARACTER*1.
             On entry, UPLO specifies whether the matrix A is an upper or
             lower triangular matrix as follows:

                UPLO = 'U' or 'u'   A is an upper triangular matrix.

                UPLO = 'L' or 'l'   A is a lower triangular matrix.

             Unchanged on exit.

    TRANSA - CHARACTER*1.
             On entry, TRANSA specifies the form of op( A ) to be used in
             the matrix multiplication as follows:

                TRANSA = 'N' or 'n'   op( A ) = A.

                TRANSA = 'T' or 't'   op( A ) = A'.

                TRANSA = 'C' or 'c'   op( A ) = A'.

             Unchanged on exit.

    DIAG   - CHARACTER*1.
             On entry, DIAG specifies whether or not A is unit triangular
             as follows:

                DIAG = 'U' or 'u'   A is assumed to be unit triangular.

                DIAG = 'N' or 'n'   A is not assumed to be unit
                                    triangular.

             Unchanged on exit.

    M      - INTEGER.
             On entry, M specifies the number of rows of B. M must be at
             least zero.
             Unchanged on exit.

    N      - INTEGER.
             On entry, N specifies the number of columns of B.  N must be
             at least zero.
             Unchanged on exit.

    ALPHA  - REAL            .
             On entry,  ALPHA specifies the scalar  alpha. When  alpha is
             zero then  A is not referenced and  B need not be set before
             entry.
             Unchanged on exit.

    A      - REAL             array of DIMENSION ( LDA, k ), where k is m
             when  SIDE = 'L' or 'l'  and is  n  when  SIDE = 'R' or 'r'.
             Before entry  with  UPLO = 'U' or 'u',  the  leading  k by k
             upper triangular part of the array  A must contain the upper
             triangular matrix  and the strictly lower triangular part of
             A is not referenced.
             Before entry  with  UPLO = 'L' or 'l',  the  leading  k by k
             lower triangular part of the array  A must contain the lower
             triangular matrix  and the strictly upper triangular part of
             A is not referenced.
             Note that when  DIAG = 'U' or 'u',  the diagonal elements of
             A  are not referenced either,  but are assumed to be  unity.
             Unchanged on exit.

    LDA    - INTEGER.
             On entry, LDA specifies the first dimension of A as declared
             in the calling (sub) program.  When  SIDE = 'L' or 'l'  then
             LDA  must be at least  max( 1, m ),  when  SIDE = 'R' or 'r'
             then LDA must be at least max( 1, n ).
             Unchanged on exit.

    B      - REAL             array of DIMENSION ( LDB, n ).
             Before entry,  the leading  m by n part of the array  B must
             contain  the  right-hand  side  matrix  B,  and  on exit  is
             overwritten by the solution matrix  X.

    LDB    - INTEGER.
             On entry, LDB specifies the first dimension of B as declared
             in  the  calling  (sub)  program.   LDB  must  be  at  least
             max( 1, m ).
             Unchanged on exit.


    Level 3 Blas routine.


    -- Written on 8-February-1989.
       Jack Dongarra, Argonne National Laboratory.
       Iain Duff, AERE Harwell.
       Jeremy Du Croz, Numerical Algorithms Group Ltd.
       Sven Hammarling, Numerical Algorithms Group Ltd.


       Test the input parameters.
*/

    /* Parameter adjustments */
    a_dim1 = *lda;
    a_offset = 1 + a_dim1;
    a -= a_offset;
    b_dim1 = *ldb;
    b_offset = 1 + b_dim1;
    b -= b_offset;

    /* Function Body */
    lside = lsame_(side, "L");
    if (lside) {
	nrowa = *m;
    } else {
	nrowa = *n;
    }
    nounit = lsame_(diag, "N");
    upper = lsame_(uplo, "U");

    info = 0;
    if (! lside && ! lsame_(side, "R")) {
	info = 1;
    } else if (! upper && ! lsame_(uplo, "L")) {
	info = 2;
    } else if (! lsame_(transa, "N") && ! lsame_(transa,
	     "T") && ! lsame_(transa, "C")) {
	info = 3;
    } else if (! lsame_(diag, "U") && ! lsame_(diag,
	    "N")) {
	info = 4;
    } else if (*m < 0) {
	info = 5;
    } else if (*n < 0) {
	info = 6;
    } else if (*lda < max(1,nrowa)) {
	info = 9;
    } else if (*ldb < max(1,*m)) {
	info = 11;
    }
    if (info != 0) {
	xerbla_("STRSM ", &info);
	return 0;
    }

/*     Quick return if possible. */

    if (*n == 0) {
	return 0;
    }

/*     And when  alpha.eq.zero. */

    if (*alpha == 0.f) {
	i__1 = *n;
	for (j = 1; j <= i__1; ++j) {
	    i__2 = *m;
	    for (i__ = 1; i__ <= i__2; ++i__) {
		b[i__ + j * b_dim1] = 0.f;
/* L10: */
	    }
/* L20: */
	}
	return 0;
    }

/*     Start the operations. */

    if (lside) {
	if (lsame_(transa, "N")) {

/*           Form  B := alpha*inv( A )*B. */

	    if (upper) {
		i__1 = *n;
		for (j = 1; j <= i__1; ++j) {
		    if (*alpha != 1.f) {
			i__2 = *m;
			for (i__ = 1; i__ <= i__2; ++i__) {
			    b[i__ + j * b_dim1] = *alpha * b[i__ + j * b_dim1]
				    ;
/* L30: */
			}
		    }
		    for (k = *m; k >= 1; --k) {
			if (b[k + j * b_dim1] != 0.f) {
			    if (nounit) {
				b[k + j * b_dim1] /= a[k + k * a_dim1];
			    }
			    i__2 = k - 1;
			    for (i__ = 1; i__ <= i__2; ++i__) {
				b[i__ + j * b_dim1] -= b[k + j * b_dim1] * a[
					i__ + k * a_dim1];
/* L40: */
			    }
			}
/* L50: */
		    }
/* L60: */
		}
	    } else {
		i__1 = *n;
		for (j = 1; j <= i__1; ++j) {
		    if (*alpha != 1.f) {
			i__2 = *m;
			for (i__ = 1; i__ <= i__2; ++i__) {
			    b[i__ + j * b_dim1] = *alpha * b[i__ + j * b_dim1]
				    ;
/* L70: */
			}
		    }
		    i__2 = *m;
		    for (k = 1; k <= i__2; ++k) {
			if (b[k + j * b_dim1] != 0.f) {
			    if (nounit) {
				b[k + j * b_dim1] /= a[k + k * a_dim1];
			    }
			    i__3 = *m;
			    for (i__ = k + 1; i__ <= i__3; ++i__) {
				b[i__ + j * b_dim1] -= b[k + j * b_dim1] * a[
					i__ + k * a_dim1];
/* L80: */
			    }
			}
/* L90: */
		    }
/* L100: */
		}
	    }
	} else {

/*           Form  B := alpha*inv( A' )*B. */

	    if (upper) {
		i__1 = *n;
		for (j = 1; j <= i__1; ++j) {
		    i__2 = *m;
		    for (i__ = 1; i__ <= i__2; ++i__) {
			temp = *alpha * b[i__ + j * b_dim1];
			i__3 = i__ - 1;
			for (k = 1; k <= i__3; ++k) {
			    temp -= a[k + i__ * a_dim1] * b[k + j * b_dim1];
/* L110: */
			}
			if (nounit) {
			    temp /= a[i__ + i__ * a_dim1];
			}
			b[i__ + j * b_dim1] = temp;
/* L120: */
		    }
/* L130: */
		}
	    } else {
		i__1 = *n;
		for (j = 1; j <= i__1; ++j) {
		    for (i__ = *m; i__ >= 1; --i__) {
			temp = *alpha * b[i__ + j * b_dim1];
			i__2 = *m;
			for (k = i__ + 1; k <= i__2; ++k) {
			    temp -= a[k + i__ * a_dim1] * b[k + j * b_dim1];
/* L140: */
			}
			if (nounit) {
			    temp /= a[i__ + i__ * a_dim1];
			}
			b[i__ + j * b_dim1] = temp;
/* L150: */
		    }
/* L160: */
		}
	    }
	}
    } else {
	if (lsame_(transa, "N")) {

/*           Form  B := alpha*B*inv( A ). */

	    if (upper) {
		i__1 = *n;
		for (j = 1; j <= i__1; ++j) {
		    if (*alpha != 1.f) {
			i__2 = *m;
			for (i__ = 1; i__ <= i__2; ++i__) {
			    b[i__ + j * b_dim1] = *alpha * b[i__ + j * b_dim1]
				    ;
/* L170: */
			}
		    }
		    i__2 = j - 1;
		    for (k = 1; k <= i__2; ++k) {
			if (a[k + j * a_dim1] != 0.f) {
			    i__3 = *m;
			    for (i__ = 1; i__ <= i__3; ++i__) {
				b[i__ + j * b_dim1] -= a[k + j * a_dim1] * b[
					i__ + k * b_dim1];
/* L180: */
			    }
			}
/* L190: */
		    }
		    if (nounit) {
			temp = 1.f / a[j + j * a_dim1];
			i__2 = *m;
			for (i__ = 1; i__ <= i__2; ++i__) {
			    b[i__ + j * b_dim1] = temp * b[i__ + j * b_dim1];
/* L200: */
			}
		    }
/* L210: */
		}
	    } else {
		for (j = *n; j >= 1; --j) {
		    if (*alpha != 1.f) {
			i__1 = *m;
			for (i__ = 1; i__ <= i__1; ++i__) {
			    b[i__ + j * b_dim1] = *alpha * b[i__ + j * b_dim1]
				    ;
/* L220: */
			}
		    }
		    i__1 = *n;
		    for (k = j + 1; k <= i__1; ++k) {
			if (a[k + j * a_dim1] != 0.f) {
			    i__2 = *m;
			    for (i__ = 1; i__ <= i__2; ++i__) {
				b[i__ + j * b_dim1] -= a[k + j * a_dim1] * b[
					i__ + k * b_dim1];
/* L230: */
			    }
			}
/* L240: */
		    }
		    if (nounit) {
			temp = 1.f / a[j + j * a_dim1];
			i__1 = *m;
			for (i__ = 1; i__ <= i__1; ++i__) {
			    b[i__ + j * b_dim1] = temp * b[i__ + j * b_dim1];
/* L250: */
			}
		    }
/* L260: */
		}
	    }
	} else {

/*           Form  B := alpha*B*inv( A' ). */

	    if (upper) {
		for (k = *n; k >= 1; --k) {
		    if (nounit) {
			temp = 1.f / a[k + k * a_dim1];
			i__1 = *m;
			for (i__ = 1; i__ <= i__1; ++i__) {
			    b[i__ + k * b_dim1] = temp * b[i__ + k * b_dim1];
/* L270: */
			}
		    }
		    i__1 = k - 1;
		    for (j = 1; j <= i__1; ++j) {
			if (a[j + k * a_dim1] != 0.f) {
			    temp = a[j + k * a_dim1];
			    i__2 = *m;
			    for (i__ = 1; i__ <= i__2; ++i__) {
				b[i__ + j * b_dim1] -= temp * b[i__ + k *
					b_dim1];
/* L280: */
			    }
			}
/* L290: */
		    }
		    if (*alpha != 1.f) {
			i__1 = *m;
			for (i__ = 1; i__ <= i__1; ++i__) {
			    b[i__ + k * b_dim1] = *alpha * b[i__ + k * b_dim1]
				    ;
/* L300: */
			}
		    }
/* L310: */
		}
	    } else {
		i__1 = *n;
		for (k = 1; k <= i__1; ++k) {
		    if (nounit) {
			temp = 1.f / a[k + k * a_dim1];
			i__2 = *m;
			for (i__ = 1; i__ <= i__2; ++i__) {
			    b[i__ + k * b_dim1] = temp * b[i__ + k * b_dim1];
/* L320: */
			}
		    }
		    i__2 = *n;
		    for (j = k + 1; j <= i__2; ++j) {
			if (a[j + k * a_dim1] != 0.f) {
			    temp = a[j + k * a_dim1];
			    i__3 = *m;
			    for (i__ = 1; i__ <= i__3; ++i__) {
				b[i__ + j * b_dim1] -= temp * b[i__ + k *
					b_dim1];
/* L330: */
			    }
			}
/* L340: */
		    }
		    if (*alpha != 1.f) {
			i__2 = *m;
			for (i__ = 1; i__ <= i__2; ++i__) {
			    b[i__ + k * b_dim1] = *alpha * b[i__ + k * b_dim1]
				    ;
/* L350: */
			}
		    }
/* L360: */
		}
	    }
	}
    }

    return 0;

/*     End of STRSM . */

}